

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_UINT32 p_num_comps;
  uint p_tx0;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint p_tx1;
  OPJ_UINT32 OVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  opj_image_comp_t *poVar14;
  opj_tccp_t *poVar15;
  uint uVar16;
  OPJ_UINT32 p_dx_min;
  uint uVar17;
  uint uVar18;
  OPJ_UINT32 p_max_res;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  OPJ_UINT32 in_stack_ffffffffffffff10;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x845,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image == (opj_image_t *)0x0) {
    __assert_fail("p_image != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x846,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  uVar1 = p_cp->tw;
  if (p_cp->th * uVar1 <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x847,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  uVar19 = 0;
  uVar5 = p_cp->tdx;
  uVar8 = (p_tile_no % uVar1) * uVar5 + p_cp->tx0;
  uVar21 = p_cp->tdy;
  p_tx0 = p_image->x0;
  if (p_image->x0 < uVar8) {
    p_tx0 = uVar8;
  }
  p_tx1 = uVar8 + uVar5;
  if (CARRY4(uVar8,uVar5)) {
    p_tx1 = 0xffffffff;
  }
  if (p_image->x1 <= p_tx1) {
    p_tx1 = p_image->x1;
  }
  uVar5 = (p_tile_no / uVar1) * uVar21 + p_cp->ty0;
  uVar1 = p_image->y0;
  if (p_image->y0 < uVar5) {
    uVar1 = uVar5;
  }
  uVar8 = uVar5 + uVar21;
  if (CARRY4(uVar5,uVar21)) {
    uVar8 = 0xffffffff;
  }
  if (p_image->y1 <= uVar8) {
    uVar8 = p_image->y1;
  }
  p_num_comps = p_image->numcomps;
  if (p_num_comps == 0) {
    p_max_res = 0x7fffffff;
    uVar5 = 0;
    p_dx_min = 0x7fffffff;
  }
  else {
    poVar15 = p_cp->tcps[p_tile_no].tccps;
    poVar14 = p_image->comps;
    p_max_res = 0x7fffffff;
    uVar19 = 0;
    uVar5 = 0;
    p_dx_min = 0x7fffffff;
    OVar9 = 0;
    do {
      uVar12 = (ulong)poVar14->dx;
      if (uVar12 == 0) {
LAB_0012be16:
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                      ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
      }
      uVar22 = (ulong)poVar14->dy;
      if (uVar22 == 0) goto LAB_0012be16;
      uVar21 = poVar15->numresolutions;
      uVar23 = (ulong)uVar21;
      uVar18 = uVar21;
      if ((uVar5 < uVar21) || (uVar18 = uVar5, uVar21 != 0)) {
        uVar5 = uVar18;
        lVar13 = 0xec;
        uVar18 = uVar19;
        do {
          uVar21 = uVar21 - 1;
          bVar2 = (byte)uVar21;
          bVar3 = (byte)*(undefined4 *)((long)poVar15 + lVar13 * 4 + -0x84);
          uVar19 = poVar14->dx << (bVar2 + bVar3 & 0x1f);
          bVar4 = (byte)*(undefined4 *)((long)poVar15->stepsizes + lVar13 * 4 + -0x1c);
          uVar17 = poVar14->dy << (bVar2 + bVar4 & 0x1f);
          if (p_max_res < uVar19) {
            uVar19 = p_max_res;
          }
          p_max_res = uVar19;
          if (p_dx_min < uVar17) {
            uVar17 = p_dx_min;
          }
          p_dx_min = uVar17;
          uVar10 = -1L << (bVar2 & 0x3f) ^ 0xffffffffffffffff;
          uVar6 = (((uVar12 - 1) + (ulong)p_tx1) / uVar12 & 0xffffffff) + uVar10 >> (bVar2 & 0x3f);
          uVar11 = uVar10 + (((uVar8 + uVar22) - 1) / uVar22 & 0xffffffff) >> (bVar2 & 0x3f);
          uVar20 = (uint)((((p_tx0 + uVar12) - 1) / uVar12 & 0xffffffff) + uVar10 >> (bVar2 & 0x3f))
          ;
          uVar19 = (uint)((((uVar1 + uVar22) - 1) / uVar22 & 0xffffffff) + uVar10 >> (bVar2 & 0x3f))
          ;
          uVar16 = 0 >> (bVar3 & 0x1f);
          uVar17 = ((int)(~(-1L << (bVar3 & 0x3f)) + (uVar6 & 0xffffffff) >> (bVar3 & 0x3f)) -
                    (uVar20 >> (bVar3 & 0x1f)) << (bVar3 & 0x1f)) >> (bVar3 & 0x1f);
          if (uVar20 == (uint)uVar6) {
            uVar17 = uVar16;
          }
          uVar20 = ((int)(~(-1L << (bVar4 & 0x3f)) + (uVar11 & 0xffffffff) >> (bVar4 & 0x3f)) -
                    (uVar19 >> (bVar4 & 0x1f)) << (bVar4 & 0x1f)) >> (bVar4 & 0x1f);
          if (uVar19 == (uint)uVar11) {
            uVar20 = uVar16;
          }
          uVar19 = uVar20 * uVar17;
          if (uVar20 * uVar17 <= uVar18) {
            uVar19 = uVar18;
          }
          lVar7 = lVar13 - uVar23;
          lVar13 = lVar13 + 1;
          uVar18 = uVar19;
        } while (lVar7 != 0xeb);
      }
      poVar14 = poVar14 + 1;
      poVar15 = poVar15 + 1;
      OVar9 = OVar9 + 1;
    } while (OVar9 != p_num_comps);
  }
  if ((p_cp->tcps[p_tile_no].field_0x1638 & 4) == 0) {
    opj_pi_update_encode_not_poc
              (p_cp,p_num_comps,p_tile_no,p_tx0,p_tx1,uVar1,uVar8,uVar19,uVar5,p_max_res,p_dx_min);
  }
  else {
    opj_pi_update_encode_poc_and_final
              (p_cp,p_tile_no,p_tx0,p_tx1,uVar1,uVar8,uVar19,p_max_res,p_dx_min,
               in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_UINT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}